

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_model.cpp
# Opt level: O0

void __thiscall ICACHE::ICACHE(ICACHE *this,CPU *cpu_pointer,BUS *bus_pointer)

{
  CPU *pCVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  uint8_t *__s;
  ulong uVar5;
  uint *__s_00;
  oraddr_t *__s_01;
  uint size;
  int way_bits;
  int set_bits;
  BUS *bus_pointer_local;
  CPU *cpu_pointer_local;
  ICACHE *this_local;
  
  (this->super_CACHE).cpu = cpu_pointer;
  (this->super_CACHE).bus_p = bus_pointer;
  (this->super_CACHE).enabled = 0;
  (this->super_CACHE).nsets = 0x200;
  (this->super_CACHE).nways = 1;
  (this->super_CACHE).blocksize = 0x10;
  (this->super_CACHE).ustates = 2;
  (this->super_CACHE).hitdelay = 1;
  (this->super_CACHE).missdelay = 1;
  (this->super_CACHE).mem = (uint8_t *)0x0;
  (this->super_CACHE).lrus = (uint *)0x0;
  (this->super_CACHE).tags = (oraddr_t *)0x0;
  uVar3 = (this->super_CACHE).nways * (this->super_CACHE).nsets * (this->super_CACHE).blocksize;
  if (uVar3 != 0) {
    __s = (uint8_t *)operator_new__((ulong)uVar3);
    memset(__s,0,(ulong)uVar3);
    (this->super_CACHE).mem = __s;
    auVar2 = ZEXT416((this->super_CACHE).nsets * (this->super_CACHE).nways) * ZEXT816(4);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    __s_00 = (uint *)operator_new__(uVar5);
    memset(__s_00,0,uVar5);
    (this->super_CACHE).lrus = __s_00;
    auVar2 = ZEXT416((this->super_CACHE).nsets * (this->super_CACHE).nways) * ZEXT816(4);
    uVar5 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    __s_01 = (oraddr_t *)operator_new__(uVar5);
    memset(__s_01,0,uVar5);
    (this->super_CACHE).tags = __s_01;
  }
  uVar3 = CACHE::log2_int(&this->super_CACHE,(ulong)(this->super_CACHE).blocksize);
  (this->super_CACHE).blocksize_log2 = uVar3;
  (this->super_CACHE).set_mask =
       (this->super_CACHE).nsets - 1 << ((byte)(this->super_CACHE).blocksize_log2 & 0x1f);
  (this->super_CACHE).tagaddr_mask =
       (this->super_CACHE).nsets * (this->super_CACHE).blocksize - 1 ^ 0xffffffff;
  (this->super_CACHE).last_way = (this->super_CACHE).nsets * (this->super_CACHE).nways;
  (this->super_CACHE).block_offset_mask = (this->super_CACHE).blocksize - 1;
  (this->super_CACHE).block_mask = (this->super_CACHE).block_offset_mask ^ 0xffffffff;
  (this->super_CACHE).ustates_reload = (this->super_CACHE).ustates - 1;
  if ((this->super_CACHE).enabled == 0) {
    pCVar1 = (this->super_CACHE).cpu;
    pCVar1->sprs[1] = pCVar1->sprs[1] & 0xfffffffb;
  }
  else {
    pCVar1 = (this->super_CACHE).cpu;
    pCVar1->sprs[1] = pCVar1->sprs[1] | 4;
  }
  iVar4 = CACHE::log2_int(&this->super_CACHE,(ulong)(this->super_CACHE).nsets);
  pCVar1 = (this->super_CACHE).cpu;
  pCVar1->sprs[6] = pCVar1->sprs[6] & 0xffffff87;
  pCVar1 = (this->super_CACHE).cpu;
  pCVar1->sprs[6] = iVar4 << 3 | pCVar1->sprs[6];
  uVar3 = CACHE::log2_int(&this->super_CACHE,(ulong)(this->super_CACHE).nways);
  pCVar1 = (this->super_CACHE).cpu;
  pCVar1->sprs[6] = pCVar1->sprs[6] & 0xfffffff8;
  pCVar1 = (this->super_CACHE).cpu;
  pCVar1->sprs[6] = uVar3 | pCVar1->sprs[6];
  if ((this->super_CACHE).blocksize == 0x10) {
    pCVar1 = (this->super_CACHE).cpu;
    pCVar1->sprs[6] = pCVar1->sprs[6] & 0xffffff7f;
  }
  else {
    pCVar1 = (this->super_CACHE).cpu;
    pCVar1->sprs[6] = pCVar1->sprs[6] | 0x80;
  }
  return;
}

Assistant:

ICACHE::ICACHE(CPU * cpu_pointer, BUS *bus_pointer)
{
    int set_bits;
    int way_bits;
    unsigned int size = 0;

    cpu = cpu_pointer;
    bus_p = bus_pointer;
    enabled = 0;
    nsets = 512;
    nways = 1;
    blocksize = MIN_IC_BLOCK_SIZE;
    ustates = 2;
    hitdelay = 1;
    missdelay = 1;

    mem = NULL; /* Internal configuration */
    lrus = NULL;
    tags = NULL;

    size = nways * nsets * blocksize;
    if(size)
    {
        mem = new uint8_t[size]();
        lrus = new unsigned int[nsets*nways]();
        tags = new oraddr_t[nsets*nways]();

    }

    blocksize_log2 = log2_int(blocksize);
    set_mask = (nsets - 1) << blocksize_log2;
    tagaddr_mask = ~((nsets * blocksize) - 1);
    last_way = nsets * nways;
    block_offset_mask = blocksize - 1;
    block_mask = ~block_offset_mask;
    ustates_reload = ustates - 1;

    /* Set SPRs as appropriate */

    if (enabled)
    {
        cpu->sprs[SPR_UPR] |= SPR_UPR_ICP;
    }
    else
    {
        cpu->sprs[SPR_UPR] &= ~SPR_UPR_ICP;
    }

    set_bits = log2_int(nsets);
    cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_NCS;
    cpu->sprs[SPR_ICCFGR] |= set_bits << SPR_ICCFGR_NCS_OFF;

    way_bits = log2_int(nways);
    cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_NCW;
    cpu->sprs[SPR_ICCFGR] |= way_bits << SPR_ICCFGR_NCW_OFF;

    if (MIN_IC_BLOCK_SIZE == blocksize)
    {
        cpu->sprs[SPR_ICCFGR] &= ~SPR_ICCFGR_CBS;
    }
    else
    {
        cpu->sprs[SPR_ICCFGR] |= SPR_ICCFGR_CBS;
    }
}